

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

double Cudd_Density(DdManager *dd,DdNode *f,int nvars)

{
  int iVar1;
  double dVar2;
  
  if (nvars == 0) {
    nvars = dd->size;
  }
  dVar2 = Cudd_CountMinterm(dd,f,nvars);
  if ((dVar2 != -1.0) || (NAN(dVar2))) {
    iVar1 = ddDagInt((DdNode *)((ulong)f & 0xfffffffffffffffe));
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    dVar2 = dVar2 / (double)iVar1;
  }
  return dVar2;
}

Assistant:

double
Cudd_Density(
  DdManager * dd /* manager */,
  DdNode * f /* function whose density is sought */,
  int  nvars /* size of the support of f */)
{
    double minterms;
    int nodes;
    double density;

    if (nvars == 0) nvars = dd->size;
    minterms = Cudd_CountMinterm(dd,f,nvars);
    if (minterms == (double) CUDD_OUT_OF_MEM) return(minterms);
    nodes = Cudd_DagSize(f);
    density = minterms / (double) nodes;
    return(density);

}